

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdef.c
# Opt level: O3

void mdef_dump(FILE *fp,mdef_t *m)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  char buf [1024];
  char local_438 [1032];
  
  fprintf((FILE *)fp,"%d ciphone\n",(ulong)(uint)m->n_ciphone);
  fprintf((FILE *)fp,"%d phone\n",(ulong)(uint)m->n_phone);
  fprintf((FILE *)fp,"%d emitstate\n",(ulong)(uint)m->n_emit_state);
  fprintf((FILE *)fp,"%d cisen\n",(ulong)(uint)m->n_ci_sen);
  fprintf((FILE *)fp,"%d sen\n",(ulong)(uint)m->n_sen);
  fprintf((FILE *)fp,"%d tmat\n",(ulong)(uint)m->n_tmat);
  if (0 < m->n_phone) {
    lVar3 = 0;
    do {
      mdef_phone_str(m,(s3pid_t)lVar3,local_438);
      uVar1 = m->phone[lVar3].ssid;
      fprintf((FILE *)fp,"%3d %5d",(ulong)(uint)m->phone[lVar3].tmat,(ulong)uVar1);
      if (0 < m->n_emit_state) {
        lVar2 = 0;
        do {
          fprintf((FILE *)fp," %5d",(ulong)(uint)(int)m->sseq[(int)uVar1][lVar2]);
          lVar2 = lVar2 + 1;
        } while (lVar2 < m->n_emit_state);
      }
      fputc(9,(FILE *)fp);
      if (0 < m->n_emit_state) {
        lVar2 = 0;
        do {
          fprintf((FILE *)fp," %3d",(ulong)(uint)(int)m->cd2cisen[m->sseq[(int)uVar1][lVar2]]);
          lVar2 = lVar2 + 1;
        } while (lVar2 < m->n_emit_state);
      }
      fprintf((FILE *)fp,"\t%s\n",local_438);
      lVar3 = lVar3 + 1;
    } while (lVar3 < m->n_phone);
  }
  fflush((FILE *)fp);
  return;
}

Assistant:

void
mdef_dump(FILE * fp, mdef_t * m)
{
    int32 i, j;
    int32 ssid;
    char buf[1024];

    fprintf(fp, "%d ciphone\n", m->n_ciphone);
    fprintf(fp, "%d phone\n", m->n_phone);
    fprintf(fp, "%d emitstate\n", m->n_emit_state);
    fprintf(fp, "%d cisen\n", m->n_ci_sen);
    fprintf(fp, "%d sen\n", m->n_sen);
    fprintf(fp, "%d tmat\n", m->n_tmat);

    for (i = 0; i < m->n_phone; i++) {
        mdef_phone_str(m, i, buf);
        ssid = m->phone[i].ssid;

        fprintf(fp, "%3d %5d", m->phone[i].tmat, ssid);
        for (j = 0; j < m->n_emit_state; j++)
            fprintf(fp, " %5d", m->sseq[ssid][j]);
        fprintf(fp, "\t");
        for (j = 0; j < m->n_emit_state; j++)
            fprintf(fp, " %3d", m->cd2cisen[m->sseq[ssid][j]]);
        fprintf(fp, "\t%s\n", buf);
    }

    fflush(fp);
}